

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::renameCurrent(QFileDialogPrivate *this)

{
  QFileDialog *this_00;
  ViewMode VVar1;
  long lVar2;
  long in_FS_OFFSET;
  QModelIndex local_60;
  undefined1 *local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex
            ((QModelIndex *)&local_48,(QAbstractItemView *)((this->qFileDialogUi).d)->listView);
  QModelIndex::sibling(&local_60,(QModelIndex *)&local_48,(int)local_48,0);
  local_38.ptr = local_60.m.ptr;
  local_48 = (undefined1 *)local_60._0_8_;
  puStack_40 = (undefined1 *)local_60.i;
  VVar1 = QFileDialog::viewMode(this_00);
  lVar2 = 0xa0;
  if (VVar1 == List) {
    lVar2 = 0x88;
  }
  QAbstractItemView::edit
            (*(QAbstractItemView **)((long)&((this->qFileDialogUi).d)->gridLayout + lVar2),
             (QModelIndex *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::renameCurrent()
{
    Q_Q(QFileDialog);
    QModelIndex index = qFileDialogUi->listView->currentIndex();
    index = index.sibling(index.row(), 0);
    if (q->viewMode() == QFileDialog::List)
        qFileDialogUi->listView->edit(index);
    else
        qFileDialogUi->treeView->edit(index);
}